

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O2

void __thiscall hwnet::TCPListener::OnActive(TCPListener *this,int event)

{
  mutex *__mutex;
  Poller *this_00;
  Ptr local_40;
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  __mutex = &this->mtx;
  std::mutex::lock(__mutex);
  if ((event & 1U) != 0) {
    this->readableVer = this->readableVer + 1;
  }
  if (this->doing != false) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  this->doing = true;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  this_00 = this->poller_;
  std::__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::TCPListener,void>
            ((__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             (__weak_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<hwnet::TCPListener>);
  local_40.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_30;
  local_40.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_28._M_pi;
  local_30 = (element_type *)0x0;
  _Stack_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Poller::PostTask(this_00,&local_40,(ThreadPool *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28);
  return;
}

Assistant:

void TCPListener::OnActive(int event) {
	auto post = false;

	this->mtx.lock();
	
	if(event & Poller::ReadFlag()) {
		++this->readableVer;
	}

	if(!doing) {
		this->doing = true;
		post = true;
	}
	
	this->mtx.unlock();
	
	if(post) {
		poller_->PostTask(shared_from_this());
	}
}